

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O0

int mml_get_value(char **ptr)

{
  char cVar1;
  ushort **ppuVar2;
  uint local_1c;
  char c;
  uint value;
  char **ptr_local;
  
  local_1c = 0;
  while( true ) {
    cVar1 = **ptr;
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)cVar1] & 0x800) == 0) {
      return local_1c;
    }
    if (0xffff < local_1c) break;
    local_1c = local_1c * 10 + cVar1 + -0x30;
    *ptr = *ptr + 1;
  }
  return -1;
}

Assistant:

int
mml_get_value(char **ptr)
{
	unsigned int value;
	char c;

	/* get value */
	value = 0;

	for (;;) {
		c = **ptr;

		if (!isdigit(c))
			break;
		if (value > 65535)
			return (-1);

		value = (value * 10) + (c - '0');
		(*ptr)++;
	}

	/* ok */
	return (value);
}